

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_oarchive.h
# Opt level: O1

void __thiscall serialization::xml_oarchive::save_sequence_item_start(xml_oarchive *this)

{
  xml_node<char> *child;
  
  child = (xml_node<char> *)
          rapidxml::memory_pool<char>::allocate_aligned
                    (&(this->document_).super_memory_pool<char>,0x60);
  (child->super_xml_base<char>).m_parent = (xml_node<char> *)0x0;
  (child->super_xml_base<char>).m_name = (char *)0x0;
  (child->super_xml_base<char>).m_value = (char *)0x0;
  child->m_type = node_element;
  child->m_first_node = (xml_node<char> *)0x0;
  child->m_first_attribute = (xml_attribute<char> *)0x0;
  (child->super_xml_base<char>).m_name = "item";
  (child->super_xml_base<char>).m_name_size = 4;
  rapidxml::xml_node<char>::append_node(this->current_,child);
  this->current_ = child;
  return;
}

Assistant:

void save_sequence_item_start()
    {
        serialization_trace trace(__func__, "xml");
        auto node = document_.allocate_node(rapidxml::node_element, "item");
        current_->append_node(node);
        current_ = node;
    }